

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_consttex.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  undefined4 in_register_0000003c;
  double resCol [3];
  double greenCol [3];
  double redCol [3];
  Spectrum green;
  Spectrum red;
  double local_618;
  double local_610;
  double local_608;
  double local_5f8 [4];
  double local_5d8 [4];
  CoefficientSpectrum<60> local_5b8;
  CoefficientSpectrum<60> local_3d8;
  CoefficientSpectrum<60> local_1f8;
  
  phyr::SampledSpectrum::init((EVP_PKEY_CTX *)CONCAT44(in_register_0000003c,argc));
  local_5d8[0] = 1.0;
  local_5d8[1] = 0.0;
  local_5d8[2] = 0.0;
  phyr::SampledSpectrum::getFromRGB((SampledSpectrum *)&local_1f8,local_5d8,Reflectance);
  local_5f8[0] = 0.0;
  local_5f8[1] = 1.0;
  local_5f8[2] = 0.0;
  phyr::SampledSpectrum::getFromRGB((SampledSpectrum *)&local_3d8,local_5f8,Reflectance);
  phyr::CoefficientSpectrum<60>::operator*(&local_5b8,&local_1f8,&local_3d8);
  phyr::SampledSpectrum::toRGBConstants((SampledSpectrum *)&local_5b8,&local_618);
  std::operator<<((ostream *)&std::cout,"R: ");
  poVar1 = std::ostream::_M_insert<double>(local_618);
  std::operator<<(poVar1,", G: ");
  poVar1 = std::ostream::_M_insert<double>(local_610);
  std::operator<<(poVar1,", B: ");
  poVar1 = std::ostream::_M_insert<double>(local_608);
  std::endl<char,std::char_traits<char>>(poVar1);
  return 0;
}

Assistant:

int main(int argc, const char* argv[]) {
    using namespace phyr;

    // Initiate Spectrum data
    Spectrum::init();

    // Create a red Spectrum
    Real redCol[3] = { 1, 0, 0 };
    Spectrum red = Spectrum::getFromRGB(redCol, SpectrumType::Reflectance);

    Real greenCol[3] = { 0, 1, 0 };
    Spectrum green = Spectrum::getFromRGB(greenCol, SpectrumType::Reflectance);

    Real resCol[3];
    Spectrum res = red * green;
    res.toRGBConstants(resCol);

    std::cout << "R: " << resCol[0] << ", G: " << resCol[1] << ", B: " << resCol[2] <<  std::endl;
    return 0;
}